

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O3

void scopy(int n,float *dx,int incx,float *dy,int incy)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (0 < n) {
    if (incy != 1 || incx != 1) {
      pfVar3 = dx + (incx >> 0x1f & (1 - n) * incx);
      pfVar2 = dy + (incy >> 0x1f & (1 - n) * incy);
      do {
        *pfVar2 = *pfVar3;
        pfVar3 = pfVar3 + incx;
        pfVar2 = pfVar2 + incy;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar5 = (ulong)(uint)n;
    uVar1 = (uint)n % 7;
    if (uVar1 != 0) {
      uVar6 = 0;
      do {
        dy[uVar6] = dx[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    if ((int)uVar1 < n) {
      uVar6 = uVar5 / 7;
      lVar4 = 0;
      do {
        dy[uVar6 * -7 + uVar5 + lVar4] = dx[uVar6 * -7 + uVar5 + lVar4];
        dy[uVar6 * -7 + uVar5 + lVar4 + 1] = dx[uVar6 * -7 + uVar5 + lVar4 + 1];
        dy[uVar6 * -7 + uVar5 + lVar4 + 2] = dx[uVar6 * -7 + uVar5 + lVar4 + 2];
        dy[uVar6 * -7 + uVar5 + lVar4 + 3] = dx[uVar6 * -7 + uVar5 + lVar4 + 3];
        dy[uVar6 * -7 + uVar5 + lVar4 + 4] = dx[uVar6 * -7 + uVar5 + lVar4 + 4];
        dy[uVar6 * -7 + uVar5 + lVar4 + 5] = dx[uVar6 * -7 + uVar5 + lVar4 + 5];
        dy[uVar6 * -7 + uVar5 + lVar4 + 6] = dx[uVar6 * -7 + uVar5 + lVar4 + 6];
        lVar4 = lVar4 + 7;
      } while ((int)uVar6 * -7 + n + (int)lVar4 < n);
    }
  }
  return;
}

Assistant:

void scopy ( int n, float dx[], int incx, float dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    SCOPY copies a float vector X to a vector Y.
//
//  Discussion:
//
//    The routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in DX and DY.
//
//    Input, float DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of DX.
//
//    Output, float DY[*], the second vector.
//
//    Input, int INCY, the increment between successive entries of DY.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    m = n % 7;

    if ( m != 0 )
    {
      for ( i = 0; i < m; i++ )
      {
        dy[i] = dx[i];
      }
    }

    for ( i = m; i < n; i = i + 7 )
    {
      dy[i] = dx[i];
      dy[i + 1] = dx[i + 1];
      dy[i + 2] = dx[i + 2];
      dy[i + 3] = dx[i + 3];
      dy[i + 4] = dx[i + 4];
      dy[i + 5] = dx[i + 5];
      dy[i + 6] = dx[i + 6];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dy[iy] = dx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }

  }

  return;
}